

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::GLSLtoSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          GLSLtoSPIRVAttribs *Attribs)

{
  bool bVar1;
  spv_target_env TargetEnv;
  Char *Message;
  char *s;
  char (*in_RCX) [61];
  undefined1 local_1e0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> OptimizedSPIRV;
  undefined1 local_1c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> SPIRV;
  IncluderImpl Includer;
  string Preamble;
  char *pcStack_100;
  int Lengths [1];
  char *ShaderStrings [1];
  EShMessages messages;
  EProfile shProfile;
  TShader Shader;
  EShLanguage ShLang;
  undefined1 local_38 [8];
  string msg;
  GLSLtoSPIRVAttribs *Attribs_local;
  
  msg.field_2._8_8_ = Attribs;
  if ((Attribs->ShaderSource == (char *)0x0) || (Attribs->SourceCodeLen < 1)) {
    FormatString<char[26],char[61]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Attribs.ShaderSource != nullptr && Attribs.SourceCodeLen > 0",in_RCX)
    ;
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1f9);
    std::__cxx11::string::~string((string *)local_38);
  }
  Shader.environment.target._8_4_ =
       anon_unknown_4::ShaderTypeToShLanguage(*(SHADER_TYPE *)msg.field_2._8_8_);
  glslang::TShader::TShader((TShader *)&messages,Shader.environment.target._8_4_);
  ShaderStrings[0]._4_4_ = ENoProfile;
  anon_unknown_4::SetupWithSpirvVersion
            ((TShader *)&messages,(EProfile *)((long)ShaderStrings + 4),
             Shader.environment.target._8_4_,*(SpirvVersion *)(msg.field_2._8_8_ + 0x30),
             EShSourceGlsl);
  ShaderStrings[0]._0_4_ = EShMsgSpvRules;
  if ((*(int *)(msg.field_2._8_8_ + 0x30) != 4) && (*(int *)(msg.field_2._8_8_ + 0x30) != 5)) {
    ShaderStrings[0]._0_4_ = EShMsgVulkanRules|EShMsgSpvRules;
  }
  pcStack_100 = *(char **)(msg.field_2._8_8_ + 8);
  Preamble.field_2._12_4_ = *(undefined4 *)(msg.field_2._8_8_ + 0x10);
  glslang::TShader::setStringsWithLengths
            ((TShader *)&messages,&stack0xffffffffffffff00,
             (int *)(Preamble.field_2._M_local_buf + 0xc),1);
  std::__cxx11::string::string((string *)&Includer.m_DataBlobs._M_h._M_single_bucket);
  if ((*(byte *)(msg.field_2._8_8_ + 0x41) & 1) != 0) {
    std::__cxx11::string::operator+=
              ((string *)&Includer.m_DataBlobs._M_h._M_single_bucket,
               "layout(row_major) uniform;\n\n");
  }
  std::__cxx11::string::append((char *)&Includer.m_DataBlobs._M_h._M_single_bucket);
  bVar1 = ShaderMacroArray::operator_cast_to_bool((ShaderMacroArray *)(msg.field_2._8_8_ + 0x18));
  if (bVar1) {
    AppendShaderMacros((string *)&Includer.m_DataBlobs._M_h._M_single_bucket,
                       (ShaderMacroArray *)(msg.field_2._8_8_ + 0x18));
  }
  s = (char *)std::__cxx11::string::c_str();
  glslang::TShader::setPreamble((TShader *)&messages,s);
  anon_unknown_4::IncluderImpl::IncluderImpl
            ((IncluderImpl *)
             &SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             *(IShaderSourceInputStreamFactory **)(msg.field_2._8_8_ + 0x28));
  anon_unknown_4::CompileShaderInternal
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0,(TShader *)&messages,
             (EShMessages)ShaderStrings[0],
             (Includer *)
             &SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,*(char **)(msg.field_2._8_8_ + 8),
             (long)*(int *)(msg.field_2._8_8_ + 0x10),
             (bool)(*(byte *)(msg.field_2._8_8_ + 0x40) & 1),ShaderStrings[0]._4_4_,
             *(IDataBlob ***)(msg.field_2._8_8_ + 0x38));
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0);
  if (bVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0);
    OptimizedSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    TargetEnv = anon_unknown_4::SpirvVersionToSpvTargetEnv
                          (*(SpirvVersion *)(msg.field_2._8_8_ + 0x30));
    OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0,TargetEnv,
                  SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0);
    if (bVar1) {
      LogError<false,char[27]>
                (false,"GLSLtoSPIRV",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x220,(char (*) [27])"Failed to optimize SPIR-V.");
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0);
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0);
    }
    OptimizedSPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1e0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1c0);
  anon_unknown_4::IncluderImpl::~IncluderImpl
            ((IncluderImpl *)
             &SPIRV.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&Includer.m_DataBlobs._M_h._M_single_bucket);
  glslang::TShader::~TShader((TShader *)&messages);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> GLSLtoSPIRV(const GLSLtoSPIRVAttribs& Attribs)
{
    VERIFY_EXPR(Attribs.ShaderSource != nullptr && Attribs.SourceCodeLen > 0);

    const EShLanguage  ShLang = ShaderTypeToShLanguage(Attribs.ShaderType);
    ::glslang::TShader Shader(ShLang);
    ::EProfile         shProfile = EProfile::ENoProfile;

    SetupWithSpirvVersion(Shader, shProfile, ShLang, Attribs.Version, ::glslang::EShSourceGlsl);

    EShMessages messages = EShMsgSpvRules;
    static_assert(static_cast<int>(SpirvVersion::Count) == 6, "Did you add a new member to SpirvVersion? You may need to handle it here.");
    if (Attribs.Version != SpirvVersion::GL && Attribs.Version != SpirvVersion::GLES)
        messages = static_cast<EShMessages>(messages | EShMsgVulkanRules);

    const char* ShaderStrings[] = {Attribs.ShaderSource};
    int         Lengths[]       = {Attribs.SourceCodeLen};
    Shader.setStringsWithLengths(ShaderStrings, Lengths, 1);

    std::string Preamble;
    if (Attribs.UseRowMajorMatrices)
        Preamble += "layout(row_major) uniform;\n\n";
    Preamble.append("#define GLSLANG\n\n");
    if (Attribs.Macros)
        AppendShaderMacros(Preamble, Attribs.Macros);
    Shader.setPreamble(Preamble.c_str());

    IncluderImpl Includer{Attribs.pShaderSourceStreamFactory};

    auto SPIRV = CompileShaderInternal(Shader, messages, &Includer, Attribs.ShaderSource, Attribs.SourceCodeLen, Attribs.AssignBindings, shProfile, Attribs.ppCompilerOutput);
    if (SPIRV.empty())
        return SPIRV;

#ifdef USE_SPIRV_TOOLS
    auto OptimizedSPIRV = OptimizeSPIRV(SPIRV, SpirvVersionToSpvTargetEnv(Attribs.Version), SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (!OptimizedSPIRV.empty())
    {
        return OptimizedSPIRV;
    }
    else
    {
        LOG_ERROR("Failed to optimize SPIR-V.");
    }
#endif
    return SPIRV;
}